

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O0

iterator __thiscall
duckdb_re2::SparseSetT<void>::InsertInternal(SparseSetT<void> *this,bool allow_existing,int i)

{
  bool bVar1;
  uint uVar2;
  PODArray<int> *this_00;
  int *piVar3;
  uint in_EDX;
  undefined1 in_SIL;
  SparseSetT<void> *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar5;
  _Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter> *local_8;
  
  uVar5 = CONCAT13(in_SIL,in_stack_ffffffffffffffec) & 0x1ffffff;
  DebugCheckInvariants(in_RDI);
  uVar4 = in_EDX;
  uVar2 = max_size((SparseSetT<void> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                  );
  if (in_EDX < uVar2) {
    if ((uVar5 & 0x1000000) == 0) {
      create_index((SparseSetT<void> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_RDI >> 0x20));
    }
    else {
      bVar1 = contains((SparseSetT<void> *)CONCAT44(uVar5,uVar4),in_EDX);
      if (!bVar1) {
        create_index((SparseSetT<void> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
      }
    }
    DebugCheckInvariants(in_RDI);
    this_00 = (PODArray<int> *)PODArray<int>::data((PODArray<int> *)0x2622e33);
    piVar3 = PODArray<int>::operator[](this_00,in_stack_ffffffffffffffcc);
    local_8 = &(this_00->ptr_)._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
               _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
               super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter> + *piVar3;
  }
  else {
    local_8 = (_Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter> *)
              begin((SparseSetT<void> *)0x2622ddb);
  }
  return (iterator)local_8;
}

Assistant:

iterator InsertInternal(bool allow_existing, int i) {
    DebugCheckInvariants();
    if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
      assert(false && "illegal index");
      // Semantically, end() would be better here, but we already know
      // the user did something stupid, so begin() insulates them from
      // dereferencing an invalid pointer.
      return begin();
    }
    if (!allow_existing) {
      assert(!contains(i));
      create_index(i);
    } else {
      if (!contains(i))
        create_index(i);
    }
    DebugCheckInvariants();
    return dense_.data() + sparse_[i];
  }